

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvatiming.c
# Opt level: O2

int main(int argc,char **argv)

{
  undefined4 uVar1;
  nva_card *pnVar2;
  uint in_EAX;
  int iVar3;
  uint uVar4;
  u64 uVar5;
  long lVar6;
  char *__ptr;
  size_t sStack_40;
  ulong uStack_38;
  int cnum;
  
  uStack_38 = (ulong)in_EAX;
  iVar3 = nva_init();
  if (iVar3 != 0) {
    __ptr = "PCI init failure!\n";
    sStack_40 = 0x12;
LAB_0010227d:
    fwrite(__ptr,sStack_40,1,_stderr);
    return 1;
  }
  do {
    while (iVar3 = getopt(argc,argv,"c:"), pnVar2 = nva_cards, iVar3 == 99) {
      __isoc99_sscanf(_optarg,"%d",&cnum);
    }
  } while (iVar3 != -1);
  lVar6 = (long)cnum;
  if (nva_cardsnum <= cnum) {
    if (nva_cardsnum == 0) {
      __ptr = "No cards found.\n";
      sStack_40 = 0x10;
    }
    else {
      __ptr = "No such card.\n";
      sStack_40 = 0xe;
    }
    goto LAB_0010227d;
  }
  uVar1 = *(undefined4 *)((long)nva_cards[lVar6].bar0 + 0x200);
  *(undefined4 *)((long)nva_cards[lVar6].bar0 + 0x200) = 0xffffffff;
  uVar4 = pnVar2[lVar6].chipset;
  uVar5 = crystal_type(cnum);
  printf("Using card nv%x, crystal frequency = %f MHz\n\n",(double)(long)uVar5 / 1000000.0,
         (ulong)uVar4);
  time_ptimer(cnum);
  putchar(10);
  time_pgraph_dispatch_clock(cnum);
  putchar(10);
  if (pnVar2[lVar6].card_type == 0xc0) {
    time_pcounter_nvc0(cnum);
  }
  else {
    iVar3 = pnVar2[lVar6].chipset;
    if (iVar3 < 0x84) {
      if (iVar3 < 0x40) {
        if (iVar3 < 0x10) goto LAB_00101e4b;
        time_pcounter_nv10(cnum);
      }
      else {
        time_pcounter_nv40(cnum);
      }
    }
    else {
      time_pcounter_nv84(cnum);
    }
  }
  putchar(10);
LAB_00101e4b:
  if (0x4f < pnVar2[lVar6].card_type) {
    iVar3 = *(int *)((long)nva_cards[cnum].bar0 + 0x610018);
    sleep(1);
    printf("PDISPLAY clock: %d Hz\n",
           (ulong)(uint)(*(int *)((long)nva_cards[cnum].bar0 + 0x610018) - iVar3));
    putchar(10);
  }
  if (pnVar2[lVar6].chipset < 0x98 || pnVar2[lVar6].chipset == 0xa0) {
    puts("Your card doesn\'t support fuc (chipset > nv98+ && chipset != nva0 needed)");
  }
  else {
    time_fuc_engine_periodic(cnum,"PBSP",0x84000);
    time_fuc_engine_watchdog(cnum,"PBSP",0x84000);
    putchar(10);
    time_fuc_engine_periodic(cnum,"PVP",0x85000);
    time_fuc_engine_watchdog(cnum,"PVP",0x85000);
    putchar(10);
    time_fuc_engine_periodic(cnum,"PPPP",0x86000);
    time_fuc_engine_watchdog(cnum,"PPPP",0x86000);
    putchar(10);
    uVar4 = pnVar2[lVar6].chipset - 0x98;
    if ((uVar4 < 0x15) && ((0x140001U >> (uVar4 & 0x1f) & 1) != 0)) {
      time_fuc_engine_periodic(cnum,"PCRYPT",0x87000);
      time_fuc_engine_watchdog(cnum,"PCRYPT",0x87000);
      putchar(10);
    }
    else {
      puts("Your card doesn\'t support PCOPY (chipset < nva3 only)\n");
    }
    iVar3 = pnVar2[lVar6].chipset;
    if (((iVar3 < 0xa3) || (iVar3 == 0xaa)) || (iVar3 == 0xac)) {
      puts("Your card doesn\'t support PCOPY[0] (nva3+ only)\n");
    }
    else {
      time_fuc_engine_periodic(cnum,"PCOPY[0]",0x104000);
      time_fuc_engine_watchdog(cnum,"PCOPY[0]",0x104000);
      putchar(10);
    }
    if (pnVar2[lVar6].chipset - 0xc0U < 0x19) {
      time_fuc_engine_periodic(cnum,"PCOPY[1]",0x105000);
      time_fuc_engine_watchdog(cnum,"PCOPY[1]",0x105000);
      putchar(10);
    }
    else {
      puts("Your card doesn\'t support PCOPY[0] (nva3+ only)\n");
    }
    iVar3 = pnVar2[lVar6].chipset;
    if (((iVar3 < 0xa3) || (iVar3 == 0xaa)) || (iVar3 == 0xac)) {
      puts("Your card doesn\'t support PDAEMON (nva3+ only)\n");
    }
    else {
      time_fuc_engine_periodic(cnum,"PDAEMON",0x10a000);
      time_fuc_engine_watchdog(cnum,"PDAEMON",0x10a000);
      putchar(10);
    }
    if (pnVar2[lVar6].chipset == 0xaf) {
      time_fuc_engine_periodic(cnum,"PUNK1C1",0x1c1000);
      time_fuc_engine_watchdog(cnum,"PUNK1C1",0x1c1000);
      putchar(10);
    }
    else {
      puts("Your card doesn\'t support PUNK1C1 (nvaf only)\n");
    }
    if (pnVar2[lVar6].chipset == 0xd9) {
      time_fuc_engine_periodic(cnum,"PUNK1C3",0x1c3000);
      time_fuc_engine_watchdog(cnum,"PUNK1C3",0x1c3000);
      putchar(10);
    }
    else {
      puts("Your card doesn\'t support PUNK1C3 (nvd9 only)\n");
    }
    if (pnVar2[lVar6].chipset == 0xd9) {
      time_fuc_engine_periodic(cnum,"PDISPLAY",0x627000);
      time_fuc_engine_watchdog(cnum,"PDISPLAY",0x627000);
      putchar(10);
    }
    else {
      puts("Your card doesn\'t support PDISPLAY (nvd9 only)\n");
    }
    if (pnVar2[lVar6].chipset < 0xc0) {
      puts("Your card doesn\'t support PGRAPH (nvc0+ only)\n");
    }
    else {
      time_fuc_engine_periodic(cnum,"PGRAPH.CTXCTL",0x409000);
      time_fuc_engine_watchdog(cnum,"PGRAPH.CTXCTL",0x409000);
      putchar(10);
      time_fuc_engine_periodic(cnum,"PGRAPH.TP[0].CTXCTL",0x502000);
      time_fuc_engine_watchdog(cnum,"PGRAPH.TP[0].CTXCTL",0x502000);
      putchar(10);
    }
    *(undefined4 *)((long)nva_cards[cnum].bar0 + 0x200) = uVar1;
  }
  return 0;
}

Assistant:

int main(int argc, char **argv)
{
	struct nva_card *card = NULL;
	u32 pmc_enable;
	int c;
	int cnum = 0;

	if (nva_init()) {
		fprintf (stderr, "PCI init failure!\n");
		return 1;
	}

	/* Arguments parsing */
	while ((c = getopt (argc, argv, "c:")) != -1)
		switch (c) {
			case 'c':
				sscanf(optarg, "%d", &cnum);
				break;
		}

	if (cnum >= nva_cardsnum) {
		if (nva_cardsnum)
			fprintf (stderr, "No such card.\n");
		else
			fprintf (stderr, "No cards found.\n");
		return 1;
	} else
		card = &nva_cards[cnum];

	/* activate all the engines */
	pmc_enable = nva_rd32(cnum, 0x200);
	nva_wr32(cnum, 0x200, 0xffffffff);

	printf("Using card nv%x, crystal frequency = %f MHz\n\n",
	       card->chipset, crystal_type(cnum)/1000000.0);

	time_ptimer(cnum);
	printf("\n");

	time_pgraph_dispatch_clock(cnum);
	printf("\n");

	if (card->card_type == 0xc0) {
		time_pcounter_nvc0(cnum);
		printf("\n");
	} else if (card->chipset >= 0x84){
		time_pcounter_nv84(cnum);
		printf("\n");
	} else if (card->chipset >= 0x40) {
		time_pcounter_nv40(cnum);
		printf("\n");
	} else if (card->chipset >= 0x10) {
		time_pcounter_nv10(cnum);
		printf("\n");
	}

	if (card->card_type >= 0x50) {
		uint32_t t0 = nva_rd32(cnum, 0x610018);
		sleep(1);
		uint32_t t1 = nva_rd32(cnum, 0x610018);
		printf ("PDISPLAY clock: %d Hz\n", t1 - t0);
		printf("\n");
	}

	if (card->chipset < 0x98 || card->chipset == 0xa0) {
		/* restore PMC enable */
//		nva_wr32(cnum, 0x200, pmc_enable);

		printf("Your card doesn't support fuc (chipset > nv98+ && chipset != nva0 needed)\n");
		return 0;
	}

	time_fuc_engine_periodic(cnum, "PBSP", 0x84000);
	time_fuc_engine_watchdog(cnum, "PBSP", 0x84000);
	printf("\n");

	time_fuc_engine_periodic(cnum, "PVP", 0x85000);
	time_fuc_engine_watchdog(cnum, "PVP", 0x85000);
	printf("\n");

	time_fuc_engine_periodic(cnum, "PPPP", 0x86000);
	time_fuc_engine_watchdog(cnum, "PPPP", 0x86000);
	printf("\n");

	if (card->chipset == 0x98 || card->chipset == 0xaa || card->chipset == 0xac) {
		time_fuc_engine_periodic(cnum, "PCRYPT", 0x87000);
		time_fuc_engine_watchdog(cnum, "PCRYPT", 0x87000);
		printf("\n");
	} else {
		printf("Your card doesn't support PCOPY (chipset < nva3 only)\n\n");
	}

	if (card->chipset >= 0xa3 && card->chipset != 0xaa && card->chipset != 0xac) {
		time_fuc_engine_periodic(cnum, "PCOPY[0]", 0x104000);
		time_fuc_engine_watchdog(cnum, "PCOPY[0]", 0x104000);
		printf("\n");
	} else {
		printf("Your card doesn't support PCOPY[0] (nva3+ only)\n\n");
	}

	if (card->chipset >= 0xc0 && card->chipset < 0xd9) {
		time_fuc_engine_periodic(cnum, "PCOPY[1]", 0x105000);
		time_fuc_engine_watchdog(cnum, "PCOPY[1]", 0x105000);
		printf("\n");
	} else {
		printf("Your card doesn't support PCOPY[0] (nva3+ only)\n\n");
	}

	if (card->chipset >= 0xa3 && card->chipset != 0xaa && card->chipset != 0xac) {
		time_fuc_engine_periodic(cnum, "PDAEMON", 0x10a000);
		time_fuc_engine_watchdog(cnum, "PDAEMON", 0x10a000);
		printf("\n");
	} else {
		printf("Your card doesn't support PDAEMON (nva3+ only)\n\n");
	}

	if (card->chipset == 0xaf) {
		time_fuc_engine_periodic(cnum, "PUNK1C1", 0x1c1000);
		time_fuc_engine_watchdog(cnum, "PUNK1C1", 0x1c1000);
		printf("\n");
	} else {
		printf("Your card doesn't support PUNK1C1 (nvaf only)\n\n");
	}

	if (card->chipset == 0xd9) {
		time_fuc_engine_periodic(cnum, "PUNK1C3", 0x1c3000);
		time_fuc_engine_watchdog(cnum, "PUNK1C3", 0x1c3000);
		printf("\n");
	} else {
		printf("Your card doesn't support PUNK1C3 (nvd9 only)\n\n");
	}

	if (card->chipset == 0xd9) {
		time_fuc_engine_periodic(cnum, "PDISPLAY", 0x627000);
		time_fuc_engine_watchdog(cnum, "PDISPLAY", 0x627000);
		printf("\n");
	} else {
		printf("Your card doesn't support PDISPLAY (nvd9 only)\n\n");
	}

	if (card->chipset >= 0xc0) {
		time_fuc_engine_periodic(cnum, "PGRAPH.CTXCTL", 0x409000);
		time_fuc_engine_watchdog(cnum, "PGRAPH.CTXCTL", 0x409000);
		printf("\n");

		time_fuc_engine_periodic(cnum, "PGRAPH.TP[0].CTXCTL", 0x502000);
		time_fuc_engine_watchdog(cnum, "PGRAPH.TP[0].CTXCTL", 0x502000);
		printf("\n");
	} else {
		printf("Your card doesn't support PGRAPH (nvc0+ only)\n\n");
	}

	/* restore PMC enable */
	nva_wr32(cnum, 0x200, pmc_enable);

	return 0;
}